

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  iVar1 = test1();
  if (iVar1 == 0) {
    iVar1 = test2();
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      iVar1 = 0;
      goto LAB_00102888;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Fail ",5);
  iVar1 = 1;
LAB_00102888:
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  return iVar1;
}

Assistant:

int main()
{
	if(test1()==0 && test2()==0) {
		std::cout << "Ok" << std::endl;
		return EXIT_SUCCESS;
	}
	else {
		std::cout << "Fail " << std::endl;
		return EXIT_FAILURE;
	}
}